

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O0

vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *
mcts::MCTS<ttt::Board,mcts::RandomPlayout<ttt::Board>>(Board *game,longlong iterations)

{
  bool bVar1;
  reference ppVar2;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *in_RDI;
  pair<const_long,_std::pair<double,_long_long>_> it;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  *__range2_1;
  mapped_type *p;
  MCTSResults *r;
  iterator __end3;
  iterator __begin3;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *__range3;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> result;
  future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  *__range2;
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  um_results;
  int i;
  int num_threads;
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  futures;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *results;
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  *in_stack_fffffffffffffe98;
  mapped_type *in_stack_fffffffffffffea0;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *this;
  future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  *in_stack_fffffffffffffec8;
  _Node_iterator_base<std::pair<const_long,_std::pair<double,_long_long>_>,_false> local_128;
  _Node_iterator_base<std::pair<const_long,_std::pair<double,_long_long>_>,_false> local_120;
  undefined1 *local_118;
  undefined1 local_109;
  mapped_type *local_108;
  reference local_100;
  MCTSResults *local_f8;
  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  __normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
  local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [72];
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_50;
  int local_38;
  int local_34;
  undefined1 local_30 [24];
  undefined8 local_18;
  undefined8 *local_10;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ::vector((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
            *)0x1f5929);
  local_34 = std::thread::hardware_concurrency();
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    local_58 = *(undefined2 *)(local_10 + 1);
    local_60 = *local_10;
    local_50 = local_18;
    std::
    async<mcts::MCTS<ttt::Board,mcts::RandomPlayout<ttt::Board>>(ttt::Board_const&,long_long)::_lambda()_1_>
              ((launch)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (type *)in_stack_ffffffffffffff10._M_current);
    std::
    vector<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>,std::allocator<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>>>
    ::emplace_back<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>>
              ((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
                *)this,(future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                        *)in_RDI);
    std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>::~future
              ((future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *)
               0x1f59c3);
  }
  std::
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  ::unordered_map((unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
                   *)0x1f5a25);
  local_b0 = local_30;
  local_b8._M_current =
       (future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *)
       std::
       vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
       ::begin((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
                *)in_stack_fffffffffffffe98);
  std::
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ::end((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
         *)in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
    ::operator*(&local_b8);
    std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>::get
              (in_stack_fffffffffffffec8);
    std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::begin
              ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
               in_stack_fffffffffffffe98);
    local_f8 = (MCTSResults *)
               std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::end
                         ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
                          in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                               *)in_stack_fffffffffffffe98), bVar1) {
      local_100 = __gnu_cxx::
                  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                  ::operator*((__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                               *)&stack0xffffffffffffff10);
      in_stack_fffffffffffffea0 =
           std::
           unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
           ::operator[]((unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
                         *)in_stack_fffffffffffffea0,(key_type *)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffea0->first = local_100->value + in_stack_fffffffffffffea0->first;
      in_stack_fffffffffffffea0->second = local_100->total + in_stack_fffffffffffffea0->second;
      local_108 = in_stack_fffffffffffffea0;
      __gnu_cxx::
      __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
      ::operator++((__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                    *)&stack0xffffffffffffff10);
    }
    std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::~vector(this);
    __gnu_cxx::
    __normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
    ::operator++(&local_b8);
  }
  local_109 = 0;
  std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::vector
            ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)0x1f5bd0);
  local_118 = local_a8;
  local_120._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
       ::begin(in_stack_fffffffffffffe98);
  local_128._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
       ::end(in_stack_fffffffffffffe98);
  while (bVar1 = std::__detail::operator!=(&local_120,&local_128), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false>
                        *)0x1f5c1a);
    std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>::
    emplace_back<long_const&,double&,long_long&>
              ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
               (ppVar2->second).first,(long *)ppVar2->first,(double *)this,(longlong *)in_RDI);
    std::__detail::
    _Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false> *
               )in_stack_fffffffffffffea0);
  }
  local_109 = 1;
  std::
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  ::~unordered_map((unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
                    *)0x1f5c97);
  std::
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ::~vector((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
             *)this);
  return this;
}

Assistant:

std::vector<MCTSResults>
MCTS(const IGame &game, long long iterations)
{
    std::vector<std::future<std::vector<MCTSResults>>> futures;
    int num_threads = std::thread::hardware_concurrency();
    for (int i = 0; i < num_threads; ++i)
        futures.emplace_back(std::async(std::launch::async, [game, iterations] {
            std::random_device rd;
            std::mt19937 gen(rd());

            MCTSNode root(game.GetPossibleMoves().size());
            for (int i = 0; i < iterations; ++i)
                MCTS_<IGame, RandomPlayout>(&root, game, gen);
            std::vector<MCTSResults> results;
            for (const auto &it : root.children)
                results.emplace_back(it.first, it.second->value, it.second->total);
            return results;
        }));

    std::unordered_map<game::IMove, std::pair<double, long long>> um_results;
    for (auto &f : futures)
    {
        auto result = f.get();
        for (const auto &r : result)
        {
            auto &p = um_results[r.move];
            p.first += r.value, p.second += r.total;
        }
    }

    std::vector<MCTSResults> results;
    for (auto it : um_results)
        results.emplace_back(it.first, it.second.first, it.second.second);
    return results;
}